

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_contact.cpp
# Opt level: O0

void __thiscall
gim_contact_array::merge_contacts_unique(gim_contact_array *this,gim_contact_array *contacts)

{
  uint uVar1;
  uint uVar2;
  GIM_CONTACT_conflict *pGVar3;
  gim_array<GIM_CONTACT> *in_RSI;
  btVector3 *in_RDI;
  btScalar divide_average;
  uint i;
  GIM_CONTACT_conflict average_contact;
  GIM_CONTACT_conflict *in_stack_ffffffffffffff88;
  gim_array<GIM_CONTACT> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  float local_58;
  btVector3 local_54;
  uint local_44;
  GIM_CONTACT local_40;
  gim_array<GIM_CONTACT> *local_10;
  
  local_10 = in_RSI;
  gim_array<GIM_CONTACT>::clear(in_stack_ffffffffffffff90);
  uVar1 = gim_array<GIM_CONTACT>::size(local_10);
  if (uVar1 == 1) {
    gim_array<GIM_CONTACT>::back(local_10);
    gim_array<GIM_CONTACT>::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    pGVar3 = gim_array<GIM_CONTACT>::back(local_10);
    GIM_CONTACT::GIM_CONTACT(&local_40,(GIM_CONTACT *)pGVar3);
    local_44 = 1;
    while( true ) {
      uVar1 = local_44;
      uVar2 = gim_array<GIM_CONTACT>::size(local_10);
      if (uVar2 <= uVar1) break;
      pGVar3 = gim_array<GIM_CONTACT>::operator[](local_10,(ulong)local_44);
      btVector3::operator+=(&local_40.m_point,&pGVar3->m_point);
      pGVar3 = gim_array<GIM_CONTACT>::operator[](local_10,(ulong)local_44);
      in_stack_ffffffffffffff90 = (gim_array<GIM_CONTACT> *)&pGVar3->m_normal;
      gim_array<GIM_CONTACT>::operator[](local_10,(ulong)local_44);
      local_54 = ::operator*(in_RDI,(btScalar *)CONCAT44(uVar1,in_stack_ffffffffffffff98));
      btVector3::operator+=(&local_40.m_normal,&local_54);
      local_44 = local_44 + 1;
    }
    uVar1 = gim_array<GIM_CONTACT>::size(local_10);
    local_58 = 1.0 / (float)uVar1;
    btVector3::operator*=(&local_40.m_point,&local_58);
    btVector3::operator*=(&local_40.m_normal,&local_58);
    local_40.m_depth = btVector3::length((btVector3 *)0x1dc960);
    btVector3::operator/=
              ((btVector3 *)in_stack_ffffffffffffff90,(btScalar *)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void gim_contact_array::merge_contacts_unique(const gim_contact_array & contacts)
{
	clear();

	if(contacts.size()==1)
	{
		push_back(contacts.back());
		return;
	}

	GIM_CONTACT average_contact = contacts.back();

	for (GUINT i=1;i<contacts.size() ;i++ )
	{
		average_contact.m_point += contacts[i].m_point;
		average_contact.m_normal += contacts[i].m_normal * contacts[i].m_depth;
	}

	//divide
	GREAL divide_average = 1.0f/((GREAL)contacts.size());

	average_contact.m_point *= divide_average;

	average_contact.m_normal *= divide_average;

	average_contact.m_depth = average_contact.m_normal.length();

	average_contact.m_normal /= average_contact.m_depth;

}